

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int birthday_sample(int n,int *seed)

{
  int n_00;
  int iVar1;
  int *a;
  uint uVar2;
  
  uVar2 = 0;
  if (0 < n) {
    a = i4vec_uniform_ab_new(n,1,0x16d,seed);
    n_00 = n + -1;
    iVar1 = i4vec_unique_count(n_00,a);
    if (n_00 <= iVar1) {
      iVar1 = i4vec_unique_count(n,a);
      uVar2 = (uint)(iVar1 == n_00);
      operator_delete__(a);
    }
  }
  return uVar2;
}

Assistant:

int birthday_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_SAMPLE samples the Birthday Concurrence PDF.
//
//  Discussion:
//
//    The probability is the probability that the N-th person is the
//    first one to match a birthday with someone earlier.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int BIRTHDAY_SAMPLE,
//    * 1 if the first N-1 people had distinct
//      birthdays, but person N had a birthday in common with a previous person,
//    * 0 otherwise.
//
{
  int *b;
  int u1;
  int u2;
  int value;

  if ( n < 1 )
  {
    value = 0;
    return value;
  }
//
//  Choose N birthdays at random.
//
  b = i4vec_uniform_ab_new ( n, 1, 365, seed );
//
//  Are the first N-1 birthdays unique?
//
  u1 = i4vec_unique_count ( n - 1, b );

  if ( u1 < n - 1 )
  {
    value = 0;
    return value;
  }
//
//  Does the N-th birthday match an earlier one?
//
  u2 = i4vec_unique_count ( n, b );

  if ( u2 == n - 1 )
  {
    value = 1;
  }
  else
  {
    value = 0;
  }

  delete [] b;

  return value;
}